

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O2

int __thiscall QSqlTableModelPrivate::nameToIndex(QSqlTableModelPrivate *this,QString *name)

{
  int iVar1;
  long in_FS_OFFSET;
  QAnyStringView name_00;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  strippedFieldName((QString *)&local_30,this,name);
  name_00.m_size = local_30.size | 0x8000000000000000;
  name_00.field_0.m_data_utf16 = local_30.ptr;
  iVar1 = QSqlRecord::indexOf(&(this->super_QSqlQueryModelPrivate).rec,name_00);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QSqlTableModelPrivate::nameToIndex(const QString &name) const
{
    return rec.indexOf(strippedFieldName(name));
}